

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::LoadThisObject
          (ByteCodeGenerator *this,FuncInfo *funcInfo,bool thisLoadedFromParams)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  RegSlot RVar4;
  RegSlot RVar5;
  Symbol *this_00;
  undefined4 *puVar6;
  Symbol *this_01;
  ByteCodeWriter *this_02;
  RegSlot root;
  RegSlot tmpReg;
  Symbol *newTargetSym;
  Symbol *thisSym;
  bool thisLoadedFromParams_local;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *this_local;
  
  this_00 = FuncInfo::GetThisSymbol(funcInfo);
  if (this_00 == (Symbol *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x879,"(thisSym)","thisSym");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  BVar3 = FuncInfo::IsLambda(funcInfo);
  if (BVar3 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x87a,"(!funcInfo->IsLambda())","!funcInfo->IsLambda()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  BVar3 = FuncInfo::IsClassConstructor(funcInfo);
  if (BVar3 == 0) {
    bVar2 = FuncInfo::IsGlobalFunction(funcInfo);
    if (bVar2) {
      bVar2 = FuncInfo::IsGlobalFunction(funcInfo);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x8a6,"(funcInfo->IsGlobalFunction())","funcInfo->IsGlobalFunction()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      RVar4 = funcInfo->nullConstantRegister;
      RVar5 = Symbol::GetLocation(this_00);
      EmitThis(this,funcInfo,RVar5,RVar4);
    }
    else {
      bVar2 = FuncInfo::GetIsStrictMode(funcInfo);
      if (bVar2) {
        RVar4 = Symbol::GetLocation(this_00);
        Js::ByteCodeWriter::ArgIn0(&this->m_writer,RVar4);
      }
      else if (thisLoadedFromParams) {
        RVar4 = Symbol::GetLocation(this_00);
        RVar5 = Symbol::GetLocation(this_00);
        EmitThis(this,funcInfo,RVar4,RVar5);
      }
      else {
        RVar4 = FuncInfo::AcquireTmpRegister(funcInfo);
        Js::ByteCodeWriter::ArgIn0(&this->m_writer,RVar4);
        RVar5 = Symbol::GetLocation(this_00);
        EmitThis(this,funcInfo,RVar5,RVar4);
        FuncInfo::ReleaseTmpRegister(funcInfo,RVar4);
      }
    }
  }
  else {
    BVar3 = FuncInfo::IsBaseClassConstructor(funcInfo);
    if (BVar3 == 0) {
      RVar4 = Symbol::GetLocation(this_00);
      Js::ByteCodeWriter::Reg1(&this->m_writer,InitUndecl,RVar4);
    }
    else {
      this_01 = FuncInfo::GetNewTargetSymbol(funcInfo);
      if (this_01 == (Symbol *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x885,"(newTargetSym)","newTargetSym");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      this_02 = Writer(this);
      RVar4 = Symbol::GetLocation(this_00);
      RVar5 = Symbol::GetLocation(this_01);
      Js::ByteCodeWriter::Reg2(this_02,NewScObjectNoCtorFull,RVar4,RVar5);
    }
  }
  return;
}

Assistant:

void ByteCodeGenerator::LoadThisObject(FuncInfo *funcInfo, bool thisLoadedFromParams)
{
    Symbol* thisSym = funcInfo->GetThisSymbol();
    Assert(thisSym);
    Assert(!funcInfo->IsLambda());

    if (funcInfo->IsClassConstructor())
    {
        // Derived class constructors initialize 'this' to be Undecl
        //   - we'll check this value during a super call and during 'this' access
        //
        // Base class constructors initialize 'this' to a new object using new.target
        if (funcInfo->IsBaseClassConstructor())
        {
            Symbol* newTargetSym = funcInfo->GetNewTargetSymbol();
            Assert(newTargetSym);

            this->Writer()->Reg2(Js::OpCode::NewScObjectNoCtorFull, thisSym->GetLocation(), newTargetSym->GetLocation());
        }
        else
        {
            this->m_writer.Reg1(Js::OpCode::InitUndecl, thisSym->GetLocation());
        }
    }
    else if (!funcInfo->IsGlobalFunction())
    {
        //
        // thisLoadedFromParams would be true for the event Handler case,
        // "this" would have been loaded from parameters to put in the environment
        //
        if (funcInfo->GetIsStrictMode())
        {
            m_writer.ArgIn0(thisSym->GetLocation());
        }
        else if (!thisLoadedFromParams)
        {
            Js::RegSlot tmpReg = funcInfo->AcquireTmpRegister();
            m_writer.ArgIn0(tmpReg);
            EmitThis(funcInfo, thisSym->GetLocation(), tmpReg);
            funcInfo->ReleaseTmpRegister(tmpReg);
        }
        else
        {
            EmitThis(funcInfo, thisSym->GetLocation(), thisSym->GetLocation());
        }
    }
    else
    {
        Assert(funcInfo->IsGlobalFunction());
        Js::RegSlot root = funcInfo->nullConstantRegister;
        EmitThis(funcInfo, thisSym->GetLocation(), root);
    }
}